

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retArea.c
# Opt level: O0

void Abc_NtkMarkCone_rec(Abc_Obj_t *pObj,int fForward)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_24;
  int i;
  Abc_Obj_t *pNext;
  int fForward_local;
  Abc_Obj_t *pObj_local;
  
  if ((*(uint *)&pObj->field_0x14 >> 4 & 1) == 0) {
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffef | 0x10;
    if (fForward == 0) {
      for (local_24 = 0; iVar1 = Abc_ObjFaninNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
        pAVar2 = Abc_ObjFanin(pObj,local_24);
        Abc_NtkMarkCone_rec(pAVar2,0);
      }
    }
    else {
      for (local_24 = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_24 < iVar1; local_24 = local_24 + 1)
      {
        pAVar2 = Abc_ObjFanout(pObj,local_24);
        Abc_NtkMarkCone_rec(pAVar2,fForward);
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkMarkCone_rec( Abc_Obj_t * pObj, int fForward )
{
    Abc_Obj_t * pNext;
    int i;
    if ( pObj->fMarkA )
        return;
    pObj->fMarkA = 1;
    if ( fForward )
    {
        Abc_ObjForEachFanout( pObj, pNext, i )
            Abc_NtkMarkCone_rec( pNext, fForward );
    }
    else
    {
        Abc_ObjForEachFanin( pObj, pNext, i )
            Abc_NtkMarkCone_rec( pNext, fForward );
    }
}